

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseBoolFlag(char *str,char *flag,bool *value)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  undefined1 local_39;
  char *value_str;
  bool *value_local;
  char *flag_local;
  char *str_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = ParseFlagValue(str,flag,true);
  if (pcVar2 == (char *)0x0) {
    str_local._7_1_ = false;
  }
  else {
    local_39 = true;
    if ((*pcVar2 != '0') && (local_39 = true, *pcVar2 != 'f')) {
      local_39 = *pcVar2 == 'F';
    }
    *value = (bool)((local_39 ^ 0xffU) & 1);
    str_local._7_1_ = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return str_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

static bool ParseBoolFlag(const char* str, const char* flag, bool* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, true);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Converts the string value to a bool.
  *value = !(*value_str == '0' || *value_str == 'f' || *value_str == 'F');
  return true;
}